

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void redrawSystem(int n)

{
  size_type sVar1;
  reference pvVar2;
  int local_14;
  uint local_10;
  int j;
  uint i;
  int n_local;
  
  clear();
  refresh();
  local_10 = 0;
  while( true ) {
    sVar1 = std::vector<node,_std::allocator<node>_>::size(&grid);
    if (sVar1 <= local_10) break;
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
    box(pvVar2->w_main,0);
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
    box(pvVar2->w_code,0);
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
    box(pvVar2->w_divider,0);
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
    wrefresh(pvVar2->w_main);
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
    wrefresh(pvVar2->w_reg);
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
    wrefresh(pvVar2->w_code);
    pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
    wrefresh(pvVar2->w_divider);
    for (; local_14 < 4; local_14 = local_14 + 1) {
      pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
      if (pvVar2->arrows[local_14] != (arrowType *)0x0) {
        pvVar2 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(ulong)local_10);
        wrefresh(pvVar2->arrows[local_14]->win);
      }
    }
    local_10 = local_10 + 1;
  }
  drawSystemContent();
  refresh();
  return;
}

Assistant:

void redrawSystem(int n){
  clear();
  refresh();
  for(unsigned int i=0;i<grid.size();i++){
      box(grid[i].w_main,0,0);
      box(grid[i].w_code,0,0);
      box(grid[i].w_divider,0,0);
      wrefresh(grid[i].w_main);
      wrefresh(grid[i].w_reg);
      wrefresh(grid[i].w_code);
      wrefresh(grid[i].w_divider);
      for(int j;j<4;j++){
	if(grid[i].arrows[j])
	  wrefresh(grid[i].arrows[j]->win);
      }
  }
  drawSystemContent();
  refresh();
  return;
}